

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O1

LY_ERR lydjson_subtree_r(lyd_json_ctx *lydctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  ly_ctx *plVar1;
  lyjson_ctx *plVar2;
  ly_bool is_attr_00;
  undefined4 uVar3;
  size_t sVar4;
  size_t name_len_00;
  LY_ERR ret__;
  LY_ERR LVar5;
  int iVar6;
  LY_ERR LVar7;
  ly_err_item *plVar8;
  lyd_node *plVar9;
  lys_module *plVar10;
  char *pcVar11;
  lysc_node *plVar12;
  lysc_node **pplVar13;
  char *pcVar14;
  ly_ctx *plVar15;
  undefined1 *name_len_01;
  lyd_json_ctx *plVar16;
  char *pcVar17;
  lyd_node *plVar18;
  char *pcVar19;
  ushort uVar20;
  uint uVar21;
  lyd_node *plVar22;
  bool bVar23;
  LYJSON_PARSER_STATUS status;
  LYJSON_PARSER_STATUS status_1;
  ly_ctx *local_148;
  ly_bool is_meta;
  lyd_json_ctx *local_138;
  ly_bool is_attr;
  ly_ctx *local_128;
  lyd_node *node;
  lysc_node *snode;
  undefined4 local_10c;
  lyd_node *local_108;
  char *prefix;
  ushort local_f2;
  char *local_f0;
  lyd_node *local_e8;
  char *name;
  lysc_ext_instance *ext;
  size_t local_d0;
  char *local_c8;
  uint32_t val_hints;
  char *name_1;
  char *local_b0;
  char *local_a8;
  uint local_a0;
  uint local_9c;
  char *value;
  size_t prefix_len_1;
  char *dynamic_prefname;
  char *prefix_1;
  lyd_meta **local_78;
  lys_module *local_70;
  lyd_node *local_68;
  ly_set *local_60;
  size_t prefix_len;
  size_t local_50;
  char *module_name;
  size_t name_len_1;
  size_t name_len;
  
  status = lyjson_ctx_status(lydctx->jsonctx);
  prefix = (char *)0x0;
  prefix_len = 0;
  is_meta = '\0';
  snode = (lysc_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  node = (lyd_node *)0x0;
  plVar15 = lydctx->jsonctx->ctx;
  value = (char *)0x0;
  if (parent == (lyd_node *)0x0 && first_p == (lyd_node **)0x0) {
    __assert_fail("parent || first_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x630,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  if (1 < status - LYJSON_OBJECT) {
    __assert_fail("(status == LYJSON_OBJECT) || (status == LYJSON_OBJECT_NEXT)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x631,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  uVar21 = lydctx->parse_opts;
  lydctx->parse_opts = uVar21 & 0xffbfffff;
  LVar5 = lyjson_ctx_next(lydctx->jsonctx,&status);
  if (LVar5 != LY_SUCCESS) goto LAB_00134c61;
  local_138 = lydctx;
  if (status == LYJSON_OBJECT_CLOSED) {
    LVar5 = LY_SUCCESS;
    goto LAB_00134c61;
  }
  local_148 = plVar15;
  local_108 = (lyd_node *)first_p;
  local_9c = uVar21;
  local_60 = parsed;
  if (status != LYJSON_OBJECT_NAME) {
    __assert_fail("status == LYJSON_OBJECT_NAME",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x63f,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  local_e8 = parent;
  lydjson_parse_name(lydctx->jsonctx->value,lydctx->jsonctx->value_len,&name,&name_len,&prefix,
                     &prefix_len,&is_meta);
  lyjson_ctx_give_dynamic_value(lydctx->jsonctx,&value);
  sVar4 = prefix_len;
  pcVar17 = name;
  is_attr_00 = is_meta;
  if ((prefix_len == 0 &&
       ((name_len != 0 && (lydctx->int_opts & 0x80) != 0) &&
       (is_meta == '\0' && parent == (lyd_node *)0x0))) &&
     (iVar6 = ly_strncmp("eventTime",name,name_len), plVar16 = local_138, iVar6 == 0)) {
    LVar5 = lyjson_ctx_next(local_138->jsonctx,&status);
    if (LVar5 != LY_SUCCESS) goto LAB_00134c61;
    plVar2 = plVar16->jsonctx;
    plVar15 = plVar2->ctx;
    if (status != LYJSON_STRING) {
      pcVar17 = lyjson_token2str(LYJSON_STRING);
      pcVar11 = lyjson_token2str(status);
      ly_vlog(plVar15,(char *)0x0,LYVE_SYNTAX_JSON,"Expecting JSON %s but %s found.",pcVar17,pcVar11
             );
      LVar5 = LY_EVALID;
      goto LAB_00134c61;
    }
    pcVar11 = (char *)0x0;
    LVar5 = lyd_create_opaq(plVar15,pcVar17,name_len,prefix,sVar4,prefix,sVar4,plVar2->value,
                            plVar2->value_len,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,1,&node);
    if (LVar5 != LY_SUCCESS) goto LAB_00134c61;
    LVar5 = lyd_parser_notif_eventtime_validate(node);
    plVar22 = local_e8;
joined_r0x00134d9d:
    LVar7 = (LY_ERR)pcVar11;
    plVar9 = local_e8;
joined_r0x00134f0f:
    local_e8 = plVar22;
    if (LVar5 != LY_SUCCESS) goto LAB_00134c61;
  }
  else {
    plVar9 = local_e8;
    local_128 = (ly_ctx *)name_len;
    if ((sVar4 != 0 || name_len != 0) || is_attr_00 == '\0') {
      LVar7 = lydjson_get_snode(local_138,is_attr_00,prefix,sVar4,name,name_len,local_e8,&snode,&ext
                               );
      plVar16 = local_138;
      if (LVar7 == LY_SUCCESS) {
        if (snode == (lysc_node *)0x0) {
          is_meta = '\0';
        }
        goto LAB_00134c2e;
      }
      LVar5 = LY_SUCCESS;
      if (((LVar7 == LY_ENOT) || (LVar5 = LVar7, LVar7 != LY_EVALID)) ||
         ((local_138->val_opts & 4) == 0)) goto LAB_00134c61;
      LVar7 = lydjson_data_skip(local_138->jsonctx);
      LVar5 = LY_EVALID;
      if (LVar7 != LY_SUCCESS) {
        LVar5 = LVar7;
      }
      LVar7 = lyjson_ctx_next(plVar16->jsonctx,&status);
LAB_00134ec0:
      if (LVar7 != LY_SUCCESS) {
        LVar5 = LVar7;
      }
      goto LAB_00134c61;
    }
LAB_00134c2e:
    plVar16 = local_138;
    if (is_meta != '\0') {
      if ((sVar4 == 0 && name_len == 0) && plVar9 == (lyd_node *)0x0) {
        ly_vlog(local_148,(char *)0x0,LYVE_SYNTAX_JSON,
                "Invalid metadata format - \"@\" can be used only inside anydata, container or list entries."
               );
        plVar16 = local_138;
        plVar8 = ly_err_last(local_138->jsonctx->ctx);
        LVar5 = LY_EVALID;
        if (((plVar16 == (lyd_json_ctx *)0x0) || ((plVar16->val_opts & 4) == 0)) ||
           (pcVar17 = (char *)0x7, plVar8->vecode == LYVE_SYNTAX)) goto LAB_00134c61;
LAB_00134dfe:
        plVar9 = (lyd_node *)0x0;
      }
      else {
        pcVar17 = (char *)0x0;
        if (sVar4 != 0 || name_len != 0) goto LAB_00134dfe;
        snode = plVar9->schema;
      }
      plVar22 = local_108;
      local_c8 = prefix;
      local_d0 = sVar4;
      local_148 = (ly_ctx *)snode;
      if (prefix == (char *)0x0 && snode == (lysc_node *)0x0) {
        if (local_e8 == (lyd_node *)0x0) {
          local_c8 = "";
          local_d0 = 0;
        }
        else {
          lydjson_get_node_prefix(local_e8,(char *)0x0,0,&local_c8,&local_d0);
        }
      }
      plVar15 = local_148;
      if (plVar9 == (lyd_node *)0x0) {
        plVar9 = plVar22;
        if (local_e8 == (lyd_node *)0x0) {
LAB_00134f66:
          plVar9 = *(lyd_node **)plVar9;
        }
        else {
          if ((local_e8->schema == (lysc_node *)0x0) || ((local_e8->schema->nodetype & 0x711) != 0))
          {
            plVar9 = local_e8 + 1;
            goto LAB_00134f66;
          }
          plVar9 = (lyd_node *)0x0;
        }
        for (; plVar9 != (lyd_node *)0x0; plVar9 = plVar9->next) {
          plVar1 = (ly_ctx *)plVar9->schema;
          if (plVar15 == (ly_ctx *)0x0) {
            if (plVar1 == (ly_ctx *)0x0) {
              plVar18 = plVar9[1].next;
              iVar6 = ly_strncmp((char *)plVar9[1].schema,name,(size_t)local_128);
              plVar15 = local_148;
              if (plVar18 != (lyd_node *)0x0 && iVar6 == 0) goto LAB_00135048;
            }
            else {
              iVar6 = ly_strncmp((char *)(plVar1->dict).lock.__data.__list.__next,name,
                                 (size_t)local_128);
              plVar15 = local_148;
              if (iVar6 == 0) {
                plVar18 = (lyd_node *)plVar9->schema->module->name;
LAB_00135048:
                iVar6 = ly_strncmp((char *)plVar18,local_c8,local_d0);
                goto LAB_0013504d;
              }
            }
          }
          else if (plVar1 == (ly_ctx *)0x0) {
            plVar18 = plVar9[1].next;
            iVar6 = strcmp((char *)plVar9[1].schema,
                           (char *)(plVar15->dict).lock.__data.__list.__next);
            plVar15 = local_148;
            if (plVar18 != (lyd_node *)0x0 && iVar6 == 0) {
              iVar6 = strcmp((char *)plVar18,*(char **)((local_148->dict).lock.__align + 8));
LAB_0013504d:
              plVar15 = local_148;
              if (iVar6 == 0) goto LAB_001350e0;
            }
          }
          else if (plVar1 == plVar15) goto LAB_001350e0;
        }
        plVar9 = (lyd_node *)0x0;
      }
LAB_001350e0:
      plVar18 = local_e8;
      plVar16 = local_138;
      local_a8 = pcVar17;
      if (plVar9 == (lyd_node *)0x0) {
        uVar21 = local_138->parse_opts;
        local_138->parse_opts = uVar21 & 0xfff9ffff | 0x40000;
        if (local_c8 != (char *)0x0) {
          name = local_c8;
        }
        name_len_01 = (undefined1 *)((long)&(local_128->dict).hash_tab + local_d0 + 2);
        if (local_c8 == (char *)0x0) {
          name_len_01 = (undefined1 *)((long)&(local_128->dict).hash_tab + 1);
        }
        LVar5 = lydjson_ctx_next_parse_opaq
                          (local_138,name + -1,(size_t)name_len_01,(char *)0x0,0,local_e8,&status,
                           (lyd_node **)plVar22,&node);
        plVar16->parse_opts = uVar21;
        plVar22 = local_e8;
        local_e8 = plVar18;
        pcVar11 = local_a8;
      }
      else {
        prefix_1 = (char *)0x0;
        dynamic_prefname = (char *)0x0;
        prefix_len_1 = 0;
        plVar1 = local_138->jsonctx->ctx;
        is_attr = '\0';
        if (plVar15 == (ly_ctx *)0x0) {
          uVar20 = 1;
        }
        else {
          uVar20 = *(ushort *)&(plVar15->dict).hash_tab;
          ly_log_location((lysc_node *)plVar15,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
        }
        LVar5 = lyjson_ctx_next(plVar16->jsonctx,&status_1);
        if (LVar5 == LY_SUCCESS) {
          local_b0 = (char *)CONCAT44(local_b0._4_4_,(uint)uVar20);
          plVar22 = plVar9;
          local_128 = plVar1;
          local_f2 = uVar20;
          if (uVar20 < 0x20) {
            if (uVar20 < 8) {
              if (uVar20 == 1) goto LAB_00135301;
              if (uVar20 == 4) goto LAB_0013535e;
            }
            else {
              if (uVar20 == 8) {
                local_10c = 0;
                local_f0 = "@name/array of objects/nulls";
                uVar21 = 0;
                if (status_1 == LYJSON_ARRAY) goto LAB_001359fc;
                goto LAB_00135a83;
              }
              if (uVar20 == 0x10) goto LAB_00135301;
            }
          }
          else if (uVar20 < 0x100) {
            if (uVar20 == 0x20) {
LAB_0013535e:
              local_10c = 0;
              local_f0 = "@name/object";
              goto joined_r0x00135380;
            }
            if (uVar20 == 0x60) goto LAB_00135301;
          }
          else if (((uVar20 == 0x100) || (uVar20 == 0x200)) || (uVar20 == 0x400)) {
LAB_00135301:
            local_10c = (undefined4)CONCAT71((uint7)(byte)(uVar20 >> 8),1);
            local_f0 = "@/object";
joined_r0x00135380:
            uVar21 = 0;
            if (status_1 == LYJSON_OBJECT) {
              do {
                if (status_1 != LYJSON_OBJECT) {
                  __assert_fail("status == LYJSON_OBJECT",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                                ,0x328,
                                "LY_ERR lydjson_metadata(struct lyd_json_ctx *, const struct lysc_node *, struct lyd_node *)"
                               );
                }
                local_78 = &plVar22->meta;
                local_a0 = uVar21;
                local_68 = plVar9;
                do {
                  plVar9 = local_68;
                  LVar5 = lyjson_ctx_next(plVar16->jsonctx,&status_1);
                  if (LVar5 != LY_SUCCESS) goto LAB_00135b23;
                  if (status_1 != LYJSON_OBJECT_NAME) goto LAB_00135a83;
                  lydjson_parse_name(plVar16->jsonctx->value,plVar16->jsonctx->value_len,&name_1,
                                     &name_len_1,&prefix_1,&prefix_len_1,&is_attr);
                  lyjson_ctx_give_dynamic_value(plVar16->jsonctx,&dynamic_prefname);
                  name_len_00 = name_len_1;
                  pcVar17 = prefix_1;
                  sVar4 = prefix_len_1;
                  if (name_len_1 == 0) {
                    ly_vlog(local_128,(char *)0x0,LYVE_SYNTAX_JSON,
                            "Metadata in JSON found with an empty name, followed by: %.10s",name_1);
                    goto LAB_00135b19;
                  }
                  if (prefix_len_1 == 0) {
                    uVar21 = (uint)plVar16->jsonctx->value_len;
                    pcVar17 = plVar16->jsonctx->value;
                    pcVar11 = 
                    "Metadata in JSON must be namespace-qualified, missing prefix for \"%.*s\".";
LAB_00135cbf:
                    ly_vlog(local_128,(char *)0x0,LYVE_SYNTAX_JSON,pcVar11,(ulong)uVar21,pcVar17);
                    goto LAB_00135b19;
                  }
                  if (is_attr != '\0') {
                    uVar21 = (uint)plVar16->jsonctx->value_len;
                    pcVar17 = plVar16->jsonctx->value;
                    pcVar11 = 
                    "Invalid format of the Metadata identifier in JSON, unexpected \'@\' in \"%.*s\""
                    ;
                    goto LAB_00135cbf;
                  }
                  plVar10 = ly_ctx_get_module_implemented2(local_128,prefix_1,prefix_len_1);
                  plVar16 = local_138;
                  if (plVar10 == (lys_module *)0x0) {
                    if ((local_138->parse_opts >> 0x11 & 1) != 0) {
                      ly_vlog(local_128,(char *)0x0,LYVE_REFERENCE,
                              "Prefix \"%.*s\" of the metadata \"%.*s\" does not match any module in the context."
                              ,sVar4 & 0xffffffff,pcVar17,name_len_00,name_1);
                      LVar5 = LY_EVALID;
                      plVar16 = local_138;
                      goto LAB_00135b23;
                    }
                    if (plVar22->schema == (lysc_node *)0x0) {
                      if ((local_138->parse_opts >> 0x12 & 1) == 0) {
                        __assert_fail("lydctx->parse_opts & LYD_PARSE_OPAQ",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                                      ,0x350,
                                      "LY_ERR lydjson_metadata(struct lyd_json_ctx *, const struct lysc_node *, struct lyd_node *)"
                                     );
                      }
                      goto LAB_0013547b;
                    }
                    LVar5 = lydjson_data_skip(local_138->jsonctx);
                    if (LVar5 != LY_SUCCESS) goto LAB_00135b23;
                    status_1 = lyjson_ctx_status(plVar16->jsonctx);
                  }
                  else {
LAB_0013547b:
                    local_70 = plVar10;
                    LVar5 = lyjson_ctx_next(local_138->jsonctx,&status_1);
                    if ((LVar5 != LY_SUCCESS) ||
                       (LVar5 = lydjson_value_type_hint(plVar16->jsonctx,&status_1,&val_hints),
                       plVar16 = local_138, LVar5 != LY_SUCCESS)) goto LAB_00135b23;
                    if (plVar22->schema == (lysc_node *)0x0) {
                      lydjson_get_node_prefix(plVar22,pcVar17,sVar4,&module_name,&local_50);
                      plVar16 = local_138;
                      plVar2 = local_138->jsonctx;
                      LVar5 = lyd_create_attr(plVar22,(lyd_attr **)0x0,plVar2->ctx,name_1,
                                              name_len_00,pcVar17,sVar4,module_name,local_50,
                                              plVar2->value,plVar2->value_len,&plVar2->dynamic,
                                              LY_VALUE_JSON,(void *)0x0,val_hints);
                    }
                    else {
                      plVar2 = local_138->jsonctx;
                      LVar5 = lyd_parser_create_meta
                                        ((lyd_ctx *)local_138,plVar22,(lyd_meta **)0x0,local_70,
                                         name_1,name_len_00,plVar2->value,plVar2->value_len,
                                         &plVar2->dynamic,LY_VALUE_JSON,(void *)0x0,val_hints,
                                         plVar22->schema);
                      if (LVar5 != LY_SUCCESS) goto LAB_00135b23;
                      LVar5 = lyd_parser_set_data_flags
                                        (plVar22,local_78,(lyd_ctx *)plVar16,
                                         (lysc_ext_instance *)0x0);
                    }
                    if ((LVar5 != LY_SUCCESS) ||
                       (LVar5 = lyjson_ctx_next(plVar16->jsonctx,&status_1), LVar5 != LY_SUCCESS))
                    goto LAB_00135b23;
                  }
                } while (status_1 == LYJSON_OBJECT_NEXT);
                plVar9 = local_68;
                if (status_1 != LYJSON_OBJECT_CLOSED) break;
                if (local_f2 != 8) {
                  LVar5 = LY_SUCCESS;
                  goto LAB_00135b23;
                }
                plVar9 = plVar22->next;
                LVar5 = lyjson_ctx_next(plVar16->jsonctx,&status_1);
                uVar21 = local_a0;
                if (LVar5 != LY_SUCCESS) goto LAB_00135b23;
LAB_001359fc:
                plVar18 = plVar9;
                plVar9 = plVar22;
                while( true ) {
                  plVar22 = plVar18;
                  uVar21 = uVar21 + 1;
                  if (status_1 == LYJSON_ARRAY_CLOSED) {
                    LVar5 = LY_SUCCESS;
                    goto LAB_00135b23;
                  }
                  LVar5 = lyjson_ctx_next(plVar16->jsonctx,&status_1);
                  if (LVar5 != LY_SUCCESS) goto LAB_00135b23;
                  if ((status_1 != LYJSON_NULL) && (status_1 != LYJSON_OBJECT)) goto LAB_00135a83;
                  if ((plVar22 == (lyd_node *)0x0) || (plVar22->schema != plVar9->schema)) {
                    ly_vlog(plVar16->jsonctx->ctx,(char *)0x0,LYVE_REFERENCE,
                            "Missing JSON data instance #%u of %s:%s to be coupled with metadata.",
                            (ulong)uVar21,plVar9->schema->module->name,plVar9->schema->name);
                    LVar5 = LY_EVALID;
                    goto LAB_00135b23;
                  }
                  if (status_1 != LYJSON_NULL) break;
                  plVar18 = plVar22->next;
                  LVar5 = lyjson_ctx_next(plVar16->jsonctx,&status_1);
                  plVar9 = plVar22;
                  if (LVar5 != LY_SUCCESS) goto LAB_00135b23;
                }
              } while( true );
            }
LAB_00135a83:
            pcVar11 = lys_nodetype2str((uint16_t)local_b0);
            pcVar17 = local_f0;
            uVar3 = local_10c;
            if (plVar22 == (lyd_node *)0x0) {
              plVar12 = plVar9->schema;
              if (plVar12 != (lysc_node *)0x0) goto LAB_00135abe;
              pplVar13 = &plVar9[1].schema;
            }
            else {
              plVar12 = plVar22->schema;
              if (plVar12 == (lysc_node *)0x0) {
                pplVar13 = &plVar22[1].schema;
              }
              else {
LAB_00135abe:
                pplVar13 = (lysc_node **)&plVar12->name;
              }
            }
            plVar12 = *pplVar13;
            pcVar14 = lyjson_token2str(status_1);
            pcVar19 = "";
            if ((char)uVar3 == '\0') {
              pcVar19 = "name";
            }
            ly_vlog(local_128,(char *)0x0,LYVE_SYNTAX_JSON,
                    "The attribute(s) of %s \"%s\" is expected to be represented as JSON %s, but input data contains @%s/%s."
                    ,pcVar11,plVar12,pcVar17,pcVar14,pcVar19);
LAB_00135b19:
            LVar5 = LY_EVALID;
            goto LAB_00135b23;
          }
          ly_log(plVar1,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                 ,0x322);
          LVar5 = LY_EINT;
        }
LAB_00135b23:
        if ((LVar5 == LY_EVALID) && (LVar5 = LY_EVALID, (plVar16->val_opts & 4) != 0)) {
          LVar7 = lydjson_data_skip(plVar16->jsonctx);
          LVar5 = LY_EVALID;
          if (LVar7 != LY_SUCCESS) {
            LVar5 = LVar7;
          }
        }
        bVar23 = local_148 != (ly_ctx *)0x0;
        free(dynamic_prefname);
        ly_log_location_revert((uint)bVar23,0,0,0);
        plVar22 = local_e8;
        pcVar11 = local_a8;
      }
      local_a8 = pcVar11;
      if (LVar5 == LY_SUCCESS) {
        LVar5 = LY_SUCCESS;
      }
      goto joined_r0x00134d9d;
    }
    if (snode == (lysc_node *)0x0) {
      if ((local_138->parse_opts & 0x40000) == 0) {
        LVar5 = lydjson_data_skip(local_138->jsonctx);
        if (LVar5 != LY_SUCCESS) goto LAB_00134c61;
        LVar7 = LY_SUCCESS;
        goto LAB_00135b92;
      }
      LVar7 = LY_SUCCESS;
      if (local_128 == (ly_ctx *)0x0) {
        ly_vlog(local_138->jsonctx->ctx,(char *)0x0,LYVE_SYNTAX_JSON,
                "JSON object member name cannot be a zero-length string.");
        plVar8 = ly_err_last(plVar16->jsonctx->ctx);
        LVar5 = LY_EVALID;
        if (((plVar16 == (lyd_json_ctx *)0x0) || ((plVar16->val_opts & 4) == 0)) ||
           (LVar7 = LY_EVALID, plVar8->vecode == LYVE_SYNTAX)) goto LAB_00134c61;
      }
      LVar5 = lydjson_ctx_next_parse_opaq
                        (local_138,name,(size_t)local_128,prefix,sVar4,plVar9,&status,
                         (lyd_node **)local_108,&node);
      plVar22 = local_e8;
      goto joined_r0x00134f0f;
    }
    LVar5 = lyjson_ctx_next(local_138->jsonctx,&status);
    plVar16 = local_138;
    if (LVar5 != LY_SUCCESS) goto LAB_00134c61;
    uVar20 = snode->nodetype;
    local_a8 = (char *)0x0;
    uVar21 = (uint)uVar20;
    if (uVar20 < 0x20) {
      local_a8 = (char *)0x0;
      if (uVar20 < 8) {
        if (uVar20 == 1) goto LAB_001352e7;
        if (uVar20 == 4) {
          pcVar17 = "name/[null]";
          goto LAB_001356bf;
        }
      }
      else if (uVar20 == 8) {
        local_a8 = "name/array of values";
      }
      else if (uVar20 == 0x10) {
        local_a8 = "name/array of objects";
      }
    }
    else if (uVar20 < 0x100) {
      if (uVar20 == 0x20) {
        pcVar17 = "name/array";
LAB_001356bf:
        local_a8 = "name/value";
        if (status == LYJSON_ARRAY) {
          local_a8 = pcVar17;
        }
      }
      else if (uVar20 == 0x60) goto LAB_001352e7;
    }
    else if (((uVar20 == 0x100) || (uVar20 == 0x200)) || (uVar21 == 0x400)) {
LAB_001352e7:
      local_a8 = "name/object";
    }
    LVar7 = LY_SUCCESS;
    if (uVar20 < 0x60) {
      LVar7 = LY_SUCCESS;
      if (uVar21 < 0x21) {
        if ((0x100000012U >> ((ulong)uVar21 & 0x3f) & 1) != 0) goto LAB_0013586a;
        if ((0x10100UL >> ((ulong)uVar21 & 0x3f) & 1) != 0) {
          if (status != LYJSON_ARRAY) goto LAB_001358b8;
          LVar7 = LY_SUCCESS;
          local_b0 = prefix;
          do {
            plVar16 = local_138;
            LVar5 = lyjson_ctx_next(local_138->jsonctx,&status);
            if (LVar5 != LY_SUCCESS) goto LAB_00134c61;
            if (status == LYJSON_ARRAY_CLOSED) break;
            LVar5 = lydjson_parse_instance
                              (plVar16,plVar9,(lyd_node **)local_108,snode,ext,name,
                               (size_t)local_128,local_b0,sVar4,&status,&node);
            plVar16 = local_138;
            if (LVar5 != LY_SUCCESS) {
              if (LVar5 == LY_ENOT) goto LAB_001358b8;
              plVar8 = ly_err_last(local_138->jsonctx->ctx);
              if (((plVar16 == (lyd_json_ctx *)0x0) || (LVar5 != LY_EVALID)) ||
                 (((plVar16->val_opts & 4) == 0 ||
                  (LVar7 = LY_EVALID, plVar8->vecode == LYVE_SYNTAX)))) goto LAB_00134c61;
            }
            plVar16 = local_138;
            lydjson_maintain_children
                      (plVar9,(lyd_node **)local_108,&node,(byte)(local_138->parse_opts >> 0x15) & 1
                       ,ext);
            LVar5 = lyjson_ctx_next(plVar16->jsonctx,&status);
            if (LVar5 != LY_SUCCESS) goto LAB_00134c61;
          } while (status == LYJSON_ARRAY_NEXT);
        }
      }
    }
    else if (uVar20 < 0x200) {
      if ((uVar20 == 0x60) || (uVar20 == 0x100)) {
LAB_0013586a:
        LVar5 = lydjson_parse_instance
                          (local_138,plVar9,(lyd_node **)local_108,snode,ext,name,(size_t)local_128,
                           prefix,sVar4,&status,&node);
        if (LVar5 != LY_SUCCESS) {
          if (LVar5 == LY_ENOT) {
LAB_001358b8:
            pcVar11 = lys_nodetype2str(snode->nodetype);
            pcVar17 = snode->name;
            pcVar14 = lyjson_token2str(status);
            ly_vlog(local_148,(char *)0x0,LYVE_SYNTAX_JSON,
                    "Expecting JSON %s but %s \"%s\" is represented in input data as name/%s.",
                    local_a8,pcVar11,pcVar17,pcVar14);
            LVar5 = LY_EVALID;
            if ((plVar16->val_opts & 4) == 0) goto LAB_00134c61;
            LVar7 = lydjson_data_skip(local_138->jsonctx);
            LVar5 = LY_EVALID;
            goto LAB_00134ec0;
          }
          plVar8 = ly_err_last(plVar16->jsonctx->ctx);
          if ((((plVar16 == (lyd_json_ctx *)0x0) || (LVar5 != LY_EVALID)) ||
              ((plVar16->val_opts & 4) == 0)) || (plVar8->vecode == LYVE_SYNTAX)) goto LAB_00134c61;
        }
        LVar7 = LVar5;
        if ((snode->nodetype & 0x700) != 0) {
          plVar16->op_node = node;
        }
      }
    }
    else if ((uVar20 == 0x200) || (uVar20 == 0x400)) goto LAB_0013586a;
  }
LAB_00135b92:
  if (node != (lyd_node *)0x0 && local_60 != (ly_set *)0x0) {
    ly_set_add(local_60,node,'\x01',(uint32_t *)0x0);
  }
  plVar16 = local_138;
  lydjson_maintain_children
            (plVar9,(lyd_node **)local_108,&node,(byte)(local_138->parse_opts >> 0x15) & 1,ext);
  LVar5 = LVar7;
  if (((local_9c >> 0x16 & 1) == 0) &&
     (LVar7 = lyjson_ctx_next(plVar16->jsonctx,&status), LVar7 != LY_SUCCESS)) {
    LVar5 = LVar7;
  }
LAB_00134c61:
  free(value);
  lyd_free_tree(node);
  return LVar5;
}

Assistant:

static LY_ERR
lydjson_subtree_r(struct lyd_json_ctx *lydctx, struct lyd_node *parent, struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR r, rc = LY_SUCCESS;
    enum LYJSON_PARSER_STATUS status = lyjson_ctx_status(lydctx->jsonctx);
    const char *name, *prefix = NULL, *expected = NULL;
    size_t name_len, prefix_len = 0;
    ly_bool is_meta = 0, parse_subtree;
    const struct lysc_node *snode = NULL;
    struct lysc_ext_instance *ext = NULL;
    struct lyd_node *node = NULL, *attr_node = NULL;
    const struct ly_ctx *ctx = lydctx->jsonctx->ctx;
    char *value = NULL;

    assert(parent || first_p);
    assert((status == LYJSON_OBJECT) || (status == LYJSON_OBJECT_NEXT));

    parse_subtree = lydctx->parse_opts & LYD_PARSE_SUBTREE ? 1 : 0;
    /* all descendants should be parsed */
    lydctx->parse_opts &= ~LYD_PARSE_SUBTREE;

    r = lyjson_ctx_next(lydctx->jsonctx, &status);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    if (status == LYJSON_OBJECT_CLOSED) {
        /* empty object, fine... */
        goto cleanup;
    }

    /* process the node name */
    assert(status == LYJSON_OBJECT_NAME);
    lydjson_parse_name(lydctx->jsonctx->value, lydctx->jsonctx->value_len, &name, &name_len, &prefix, &prefix_len, &is_meta);
    lyjson_ctx_give_dynamic_value(lydctx->jsonctx, &value);

    if ((lydctx->int_opts & LYD_INTOPT_EVENTTIME) && !parent && !is_meta && name_len && !prefix_len &&
            !ly_strncmp("eventTime", name, name_len)) {
        /* parse eventTime */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        if (status != LYJSON_STRING) {
            LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s found.", lyjson_token2str(LYJSON_STRING),
                    lyjson_token2str(status));
            rc = LY_EVALID;
            goto cleanup;
        }

        /* create node */
        r = lyd_create_opaq(lydctx->jsonctx->ctx, name, name_len, prefix, prefix_len, prefix, prefix_len,
                lydctx->jsonctx->value, lydctx->jsonctx->value_len, NULL, LY_VALUE_JSON, NULL, LYD_VALHINT_STRING, &node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        /* validate the value */
        r = lyd_parser_notif_eventtime_validate(node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        goto node_parsed;
    } else if (!is_meta || name_len || prefix_len) {
        /* get the schema node */
        r = lydjson_get_snode(lydctx, is_meta, prefix, prefix_len, name, name_len, parent, &snode, &ext);
        if (r == LY_ENOT) {
            /* data parsed */
            goto cleanup;
        } else if ((r == LY_EVALID) && (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR)) {
            rc = r;

            /* skip the invalid data */
            if ((r = lydjson_data_skip(lydctx->jsonctx))) {
                rc = r;
            }
            r = lyjson_ctx_next(lydctx->jsonctx, &status);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            goto cleanup;
        } else if (r) {
            /* error */
            rc = r;
            goto cleanup;
        }

        if (!snode) {
            /* we will not be parsing it as metadata */
            is_meta = 0;
        }
    }

    if (is_meta) {
        /* parse as metadata */
        if (!name_len && !prefix_len && !parent) {
            LOGVAL(ctx, LYVE_SYNTAX_JSON,
                    "Invalid metadata format - \"@\" can be used only inside anydata, container or list entries.");
            r = LY_EVALID;
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        } else if (!name_len && !prefix_len) {
            /* parent's metadata without a name - use the schema from the parent */
            attr_node = parent;
            snode = attr_node->schema;
        }
        r = lydjson_parse_attribute(lydctx, attr_node, snode, name, name_len, prefix, prefix_len, parent, &status,
                first_p, &node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    } else if (!snode) {
        if (!(lydctx->parse_opts & LYD_PARSE_OPAQ)) {
            /* skip element with children */
            r = lydjson_data_skip(lydctx->jsonctx);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        } else {
            /* parse as an opaq node */

            /* opaq node cannot have an empty string as the name. */
            if (name_len == 0) {
                LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "JSON object member name cannot be a zero-length string.");
                r = LY_EVALID;
                LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
            }

            /* move to the second item in the name/X pair and parse opaq */
            r = lydjson_ctx_next_parse_opaq(lydctx, name, name_len, prefix, prefix_len, parent, &status, first_p, &node);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }
    } else {
        /* parse as a standard lyd_node but it can still turn out to be an opaque node */

        /* move to the second item in the name/X pair */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        /* set expected representation */
        switch (snode->nodetype) {
        case LYS_LEAFLIST:
            expected = "name/array of values";
            break;
        case LYS_LIST:
            expected = "name/array of objects";
            break;
        case LYS_LEAF:
            if (status == LYJSON_ARRAY) {
                expected = "name/[null]";
            } else {
                expected = "name/value";
            }
            break;
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_ACTION:
        case LYS_RPC:
        case LYS_ANYDATA:
            expected = "name/object";
            break;
        case LYS_ANYXML:
            if (status == LYJSON_ARRAY) {
                expected = "name/array";
            } else {
                expected = "name/value";
            }
            break;
        }

        /* check the representation according to the nodetype and then continue with the content */
        switch (snode->nodetype) {
        case LYS_LEAFLIST:
        case LYS_LIST:
            LY_CHECK_GOTO(status != LYJSON_ARRAY, representation_error);

            /* process all the values/objects */
            do {
                /* move into array/next value */
                r = lyjson_ctx_next(lydctx->jsonctx, &status);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
                if (status == LYJSON_ARRAY_CLOSED) {
                    /* empty array, fine... */
                    break;
                }

                r = lydjson_parse_instance(lydctx, parent, first_p, snode, ext, name, name_len, prefix, prefix_len,
                        &status, &node);
                if (r == LY_ENOT) {
                    goto representation_error;
                }
                LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

                lydjson_maintain_children(parent, first_p, &node,
                        lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT, ext);

                /* move after the item(s) */
                r = lyjson_ctx_next(lydctx->jsonctx, &status);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            } while (status == LYJSON_ARRAY_NEXT);

            break;
        case LYS_LEAF:
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_ACTION:
        case LYS_RPC:
        case LYS_ANYDATA:
        case LYS_ANYXML:
            /* process the value/object */
            r = lydjson_parse_instance(lydctx, parent, first_p, snode, ext, name, name_len, prefix, prefix_len,
                    &status, &node);
            if (r == LY_ENOT) {
                goto representation_error;
            }
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

            if (snode->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)) {
                /* rememeber the RPC/action/notification */
                lydctx->op_node = node;
            }
            break;
        }
    }

node_parsed:
    /* rememeber a successfully parsed node */
    if (parsed && node) {
        ly_set_add(parsed, node, 1, NULL);
    }

    /* finally connect the parsed node, is zeroed */
    lydjson_maintain_children(parent, first_p, &node,
            lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT, ext);

    if (!parse_subtree) {
        /* move after the item(s) */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    }

    /* success */
    goto cleanup;

representation_error:
    LOGVAL(ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s \"%s\" is represented in input data as name/%s.",
            expected, lys_nodetype2str(snode->nodetype), snode->name, lyjson_token2str(status));
    rc = LY_EVALID;
    if (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR) {
        /* try to skip the invalid data */
        if ((r = lydjson_data_skip(lydctx->jsonctx))) {
            rc = r;
        }
    }

cleanup:
    free(value);
    lyd_free_tree(node);
    return rc;
}